

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  size_t sVar1;
  LogMessage *pLVar2;
  pointer pcVar3;
  ulong uVar4;
  pointer pcVar5;
  LogFinisher local_71;
  LogMessage local_70;
  string *local_38;
  
  pcVar3 = (result->_M_dataplus)._M_p;
  uVar4 = result->_M_string_length;
  if ((ulong)((long)a->piece_data_ - (long)pcVar3) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x648);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_71,pLVar2);
    internal::LogMessage::~LogMessage(&local_70);
    pcVar3 = (result->_M_dataplus)._M_p;
    uVar4 = result->_M_string_length;
  }
  if ((ulong)((long)b->piece_data_ - (long)pcVar3) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x649);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_71,pLVar2);
    internal::LogMessage::~LogMessage(&local_70);
    pcVar3 = (result->_M_dataplus)._M_p;
    uVar4 = result->_M_string_length;
  }
  if ((ulong)((long)c->piece_data_ - (long)pcVar3) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x64a);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_71,pLVar2);
    internal::LogMessage::~LogMessage(&local_70);
    pcVar3 = (result->_M_dataplus)._M_p;
    uVar4 = result->_M_string_length;
  }
  if ((ulong)((long)d->piece_data_ - (long)pcVar3) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x64b);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: (uintptr_t((d).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_71,pLVar2);
    internal::LogMessage::~LogMessage(&local_70);
    uVar4 = result->_M_string_length;
  }
  std::__cxx11::string::resize
            ((ulong)result,
             (char)a->piece_size_ + (char)uVar4 + (char)b->piece_size_ + (char)c->piece_size_ +
             (char)d->piece_size_);
  pcVar3 = (result->_M_dataplus)._M_p;
  pcVar5 = pcVar3 + uVar4;
  local_38 = result;
  memcpy(pcVar5,a->piece_data_,a->piece_size_);
  pcVar5 = pcVar5 + a->piece_size_;
  memcpy(pcVar5,b->piece_data_,b->piece_size_);
  pcVar5 = pcVar5 + b->piece_size_;
  memcpy(pcVar5,c->piece_data_,c->piece_size_);
  sVar1 = c->piece_size_;
  memcpy(pcVar5 + sVar1,d->piece_data_,d->piece_size_);
  if (pcVar5 + sVar1 + d->piece_size_ != pcVar3 + local_38->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x650);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_70,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_71,pLVar2);
    internal::LogMessage::~LogMessage(&local_70);
  }
  return;
}

Assistant:

void StrAppend(string *result,
               const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c, const AlphaNum &d) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  GOOGLE_DCHECK_NO_OVERLAP(*result, d);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result->begin();
  char *out = Append4(begin + old_size, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}